

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O3

wchar_t la_verify_filetype(mode_t mode,mode_t filetype)

{
  bool bVar1;
  
  bVar1 = false;
  switch(filetype << 0x14 | filetype - 0x1000 >> 0xc) {
  case 0:
    bVar1 = (mode & 0xf000) == 0x1000;
    break;
  case 1:
    bVar1 = (mode & 0xf000) == 0x2000;
    break;
  case 3:
    bVar1 = (mode & 0xf000) == 0x4000;
    break;
  case 5:
    bVar1 = (mode & 0xf000) == 0x6000;
    break;
  case 7:
    bVar1 = (mode & 0xf000) == 0x8000;
    break;
  case 9:
    bVar1 = (mode & 0xf000) == 0xa000;
    break;
  case 0xb:
    bVar1 = (mode & 0xf000) == 0xc000;
  }
  return (wchar_t)bVar1;
}

Assistant:

static int
la_verify_filetype(mode_t mode, __LA_MODE_T filetype) {
	int ret = 0;

	switch (filetype) {
	case AE_IFREG:
		ret = (S_ISREG(mode));
		break;
	case AE_IFDIR:
		ret = (S_ISDIR(mode));
		break;
	case AE_IFLNK:
		ret = (S_ISLNK(mode));
		break;
	case AE_IFSOCK:
		ret = (S_ISSOCK(mode));
		break;
	case AE_IFCHR:
		ret = (S_ISCHR(mode));
		break;
	case AE_IFBLK:
		ret = (S_ISBLK(mode));
		break;
	case AE_IFIFO:
		ret = (S_ISFIFO(mode));
		break;
	default:
		break;
	}

	return (ret);
}